

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hh
# Opt level: O0

void __thiscall xt::RuntimeException::~RuntimeException(RuntimeException *this)

{
  RuntimeException *this_local;
  
  *(undefined ***)this = &PTR__RuntimeException_00119bb8;
  std::__cxx11::string::~string((string *)&this->data);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

RuntimeException(const std::string& error) : data(error) {}